

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O2

void __thiscall
SparseHashMapMoveTest_Emplace_KeyMoveCount_Test::SparseHashMapMoveTest_Emplace_KeyMoveCount_Test
          (SparseHashMapMoveTest_Emplace_KeyMoveCount_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00bdce00;
  return;
}

Assistant:

TEST(SparseHashMapMoveTest, Emplace_KeyMoveCount)
{
    sparse_hash_map<A, int, HashA> h;
    A::reset();
    h.emplace(1, 2);

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}